

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall
QProcessEnvironmentPrivate::insert
          (QProcessEnvironmentPrivate *this,QProcessEnvironmentPrivate *other)

{
  byte bVar1;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar2;
  Span *pSVar3;
  Entry *pEVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  _Rb_tree_node_base *p_Var7;
  long in_FS_OFFSET;
  piter local_58;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (other->vars).d.d.ptr;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                 *)0x0) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var7 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                 *)0x0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var5 != p_Var7; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    QMap<QByteArray,_QProcEnvValue>::insert
              (&this->vars,(QByteArray *)(p_Var5 + 1),(QProcEnvValue *)&p_Var5[1]._M_right);
  }
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QOrderedMutexLocker::QOrderedMutexLocker
            ((QOrderedMutexLocker *)local_48,&(this->nameMapMutex).super_QBasicMutex,
             &(other->nameMapMutex).super_QBasicMutex);
  local_58 = (piter)QHash<QString,_QByteArray>::constBegin(&other->nameMap);
  while( true ) {
    if (local_58.d == (Data<QHashPrivate::Node<QString,_QByteArray>_> *)0x0 && local_58.bucket == 0)
    break;
    pSVar3 = (local_58.d)->spans;
    uVar6 = local_58.bucket >> 7;
    pEVar4 = pSVar3[uVar6].entries;
    bVar1 = pSVar3[uVar6].offsets[(uint)local_58.bucket & 0x7f];
    QHash<QString,QByteArray>::emplace<QByteArray_const&>
              ((QHash<QString,QByteArray> *)&this->nameMap,(QString *)(pEVar4 + bVar1),
               (QByteArray *)(pEVar4[bVar1].storage.data + 0x18));
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QByteArray>_>::operator++(&local_58);
  }
  QOrderedMutexLocker::unlock((QOrderedMutexLocker *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironmentPrivate::insert(const QProcessEnvironmentPrivate &other)
{
    auto it = other.vars.constBegin();
    const auto end = other.vars.constEnd();
    for ( ; it != end; ++it)
        vars.insert(it.key(), it.value());

#ifdef Q_OS_UNIX
    const OrderedNameMapMutexLocker locker(this, &other);
    auto nit = other.nameMap.constBegin();
    const auto nend = other.nameMap.constEnd();
    for ( ; nit != nend; ++nit)
        nameMap.insert(nit.key(), nit.value());
#endif
}